

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O2

Endpoint * __thiscall
helics::MessageFederateManager::registerDataSink(MessageFederateManager *this,string_view name)

{
  Endpoint *pEVar1;
  reference pvVar2;
  RegistrationFailure *this_00;
  string_view message;
  optional<unsigned_long> oVar3;
  InterfaceHandle handle;
  handle datHandle;
  string_view name_local;
  handle eptHandle;
  
  name_local._M_str = name._M_str;
  pEVar1 = (Endpoint *)name._M_len;
  name_local._M_len = (size_t)pEVar1;
  handle.hid = (*this->coreObject->_vptr_Core[0x38])
                         (this->coreObject,(ulong)(uint)(this->fedID).fid,pEVar1,name_local._M_str);
  if (handle.hid != -1700000000) {
    gmlc::libguarded::
    shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
    ::lock(&eptHandle,&this->mLocalEndpoints);
    oVar3 = gmlc::containers::
            DualStringMappedVector<helics::Endpoint,helics::InterfaceHandle,(reference_stability)0,5>
            ::
            insert<helics::MessageFederate*&,std::basic_string_view<char,std::char_traits<char>>&,helics::InterfaceHandle&>
                      ((DualStringMappedVector<helics::Endpoint,helics::InterfaceHandle,(reference_stability)0,5>
                        *)eptHandle.data,name,&handle,&this->mFed,&name_local,&handle);
    if (((undefined1  [16])
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) !=
        (undefined1  [16])0x0) {
      pEVar1 = gmlc::containers::
               StableBlockVector<helics::Endpoint,_5U,_std::allocator<helics::Endpoint>_>::back
                         (&(eptHandle.data)->dataStorage);
      pEVar1->receiveOnly = true;
      gmlc::libguarded::
      shared_guarded_opt<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
      ::lock(&datHandle,&this->eptData);
      pvVar2 = std::
               deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>
               ::emplace_back<>(datHandle.data);
      pEVar1->dataReference = pvVar2;
      gmlc::libguarded::
      lock_handle<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
      ::unlock(&datHandle);
      pEVar1->referenceIndex =
           oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_payload._0_4_;
      std::unique_lock<std::shared_mutex>::~unique_lock(&datHandle.m_handle_lock);
    }
    std::unique_lock<std::shared_mutex>::~unique_lock(&eptHandle.m_handle_lock);
    if (((undefined1  [16])
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) !=
        (undefined1  [16])0x0) {
      return pEVar1;
    }
  }
  this_00 = (RegistrationFailure *)__cxa_allocate_exception(0x28);
  message._M_str = "Unable to register Data Sink";
  message._M_len = 0x1c;
  RegistrationFailure::RegistrationFailure(this_00,message);
  __cxa_throw(this_00,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
}

Assistant:

Endpoint& MessageFederateManager::registerDataSink(std::string_view name)
{
    auto handle = coreObject->registerDataSink(fedID, name);
    if (handle.isValid()) {
        auto eptHandle = mLocalEndpoints.lock();
        auto loc = eptHandle->insert(name, handle, mFed, name, handle);
        if (loc) {
            auto& ref = eptHandle->back();
            ref.receiveOnly = true;
            auto datHandle = eptData.lock();
            auto& edat = datHandle->emplace_back();

            // non-owning pointer
            ref.dataReference = &edat;
            datHandle.unlock();
            ref.referenceIndex = static_cast<int>(*loc);

            return ref;
        }
    }
    throw(RegistrationFailure("Unable to register Data Sink"));
}